

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Json.h
# Opt level: O1

bool __thiscall Json::IsValid(Json *this)

{
  PointerParseErrorCode errorCode;
  ParseErrorCode errorCode_00;
  size_t sVar1;
  string local_38;
  
  errorCode = (this->p).parseErrorCode_;
  if (errorCode == kPointerParseErrorNone) {
    errorCode_00 = (this->d).parseResult_.code_;
    if (errorCode_00 == kParseErrorNone) {
      return true;
    }
    sVar1 = (this->d).parseResult_.offset_;
    GetParseJsonErrorStr_abi_cxx11_(&local_38,this,errorCode_00);
    SetErrorMsg(this,"wrong json: offset:%ld. %s",sVar1,local_38._M_dataplus._M_p);
  }
  else {
    GetParseUriErrorStr_abi_cxx11_(&local_38,this,errorCode);
    SetErrorMsg(this,"wrong uri:%s",local_38._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return false;
}

Assistant:

bool IsValid()
    {
        if (!p.IsValid()) {
            SetErrorMsg("wrong uri:%s", GetParseUriErrorStr(p.GetParseErrorCode()).c_str());
            return false;
        }
        if (d.HasParseError()) {
            SetErrorMsg("wrong json: offset:%ld. %s", d.GetErrorOffset(), GetParseJsonErrorStr(d.GetParseError()).c_str());
            return false;
        }
        return true;
    }